

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

ostream * GEO::Logger::warn(string *feature)

{
  bool bVar1;
  Logger *this;
  ostream *poVar2;
  ostream *local_20;
  ostream *result;
  string *feature_local;
  
  bVar1 = is_initialized();
  if ((!bVar1) || (bVar1 = Process::is_running_threads(), bVar1)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"(W)-[");
    poVar2 = std::operator<<(poVar2,(string *)feature);
    local_20 = std::operator<<(poVar2,"] ");
  }
  else {
    this = instance();
    local_20 = warn_stream(this,feature);
  }
  return local_20;
}

Assistant:

std::ostream& Logger::warn(const std::string& feature) {
	std::ostream& result = 
	    (is_initialized() && !Process::is_running_threads()) ?	    	    
            instance()->warn_stream(feature) :
            (std::cerr << "(W)-[" << feature << "] ");
	return result;
    }